

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O3

String * __thiscall
cplus::lang::ByteArray::toBinString(String *__return_storage_ptr__,ByteArray *this)

{
  size_t sVar1;
  char *pcVar2;
  char *str;
  size_t sVar3;
  char *buffer;
  
  sVar1 = this->size;
  str = (char *)operator_new__(sVar1 * 9 + 1);
  str[sVar1 * 9] = '\0';
  if (sVar1 != 0) {
    pcVar2 = this->buffer;
    sVar3 = 0;
    buffer = str;
    do {
      binToString(pcVar2[sVar3],buffer);
      buffer[8] = ' ';
      sVar3 = sVar3 + 1;
      buffer = buffer + 9;
    } while (sVar1 != sVar3);
  }
  String::String(__return_storage_ptr__,str);
  operator_delete__(str);
  return __return_storage_ptr__;
}

Assistant:

lang::String ByteArray::toBinString() const {
			auto *buffer = new char[size * 9 + 1];
			buffer[size * 9] = 0;
			for (int index = 0; index < size; index++) {
				binToString(this->buffer[index], buffer + index * 9);
				buffer[index * 9 + 8] = ' ';
			}
			auto ret = lang::String(buffer);
			delete[] buffer;
			return ret;
		}